

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_value_table
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,apx_valueTable_t **vt)

{
  uint8_t *pBegin;
  apx_valueTable_t *paVar1;
  char c;
  uint8_t *result;
  apx_attributeParserValueTableState_t state;
  uint8_t *next;
  apx_valueTable_t **vt_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  self_local = (apx_attributeParser_t *)begin;
  if (begin < end) {
    state._64_8_ = begin + 1;
    if (*begin == '(') {
      apx_attributeParserValueTableState_create((apx_attributeParserValueTableState_t *)&result);
      do {
        while( true ) {
          if (end <= (ulong)state._64_8_) {
            return begin;
          }
          state._64_8_ = bstr_lstrip((uint8_t *)state._64_8_,end);
          pBegin = apx_attributeParser_parse_value_table_arg
                             (self,(uint8_t *)state._64_8_,end,
                              (apx_attributeParserValueTableState_t *)&result);
          if (pBegin <= (ulong)state._64_8_) {
            return begin;
          }
          if (end < pBegin) {
            __assert_fail("result <= end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,0x367,
                          "const uint8_t *apx_attributeParser_parse_value_table(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_valueTable_t **)"
                         );
          }
          state._64_8_ = pBegin;
          state._64_8_ = bstr_lstrip(pBegin,end);
          if (*(uint8_t *)state._64_8_ != ',') break;
          state._64_8_ = state._64_8_ + 1;
        }
      } while (*(uint8_t *)state._64_8_ != ')');
      paVar1 = apx_attributeParser_create_value_table_from_state
                         (self,(apx_attributeParserValueTableState_t *)&result);
      *vt = paVar1;
      if (*vt == (apx_valueTable_t *)0x0) {
        self->error_next = (uint8_t *)state._64_8_;
      }
      self_local = (apx_attributeParser_t *)(state._64_8_ + 1);
    }
    else {
      self_local = (apx_attributeParser_t *)0x0;
    }
  }
  return (uint8_t *)self_local;
}

Assistant:

static uint8_t const* apx_attributeParser_parse_value_table(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_valueTable_t** vt)
{
   uint8_t const* next = begin;
   if (next < end)
   {
      apx_attributeParserValueTableState_t state;
      if (*next++ != '(')
      {
         return NULL;
      }
      apx_attributeParserValueTableState_create(&state);

      while (next < end)
      {
         next = bstr_lstrip(next, end);
         uint8_t const* result = apx_attributeParser_parse_value_table_arg(self, next, end, &state);
         if (result > next)
         {
            assert(result <= end);
            next = result;
         }
         else
         {
            next = NULL;
            break;
         }
         next = bstr_lstrip(next, end);
         const char c = *next;
         if (c == ',')
         {
            //prepare for parsing next argument
            next++;
         }
         else if (c == ')')
         {
            //that was the last argument
            *vt = apx_attributeParser_create_value_table_from_state(self, &state);
            if (*vt == NULL)
            {
               self->error_next = next;
            }
            return next + 1;
         }
      }
   }
   return begin; //not enough characters in stream
}